

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

void __thiscall
Memory::HeapBlockMap64::Cleanup(HeapBlockMap64 *this,bool concurrentFindImplicitRoot)

{
  Node *pNVar1;
  bool bVar2;
  HeapAllocator *allocator;
  Node *nextNode;
  Node *node;
  Node **prevnext;
  bool concurrentFindImplicitRoot_local;
  HeapBlockMap64 *this_local;
  
  nextNode = this->list;
  node = (Node *)this;
  while (nextNode != (Node *)0x0) {
    HeapBlockMap32::Cleanup(&nextNode->map,concurrentFindImplicitRoot);
    pNVar1 = nextNode->next;
    if ((concurrentFindImplicitRoot) || (bVar2 = HeapBlockMap32::Empty(&nextNode->map), !bVar2)) {
      node = (Node *)&nextNode->next;
      nextNode = pNVar1;
    }
    else {
      *(Node **)node = nextNode->next;
      allocator = HeapAllocator::GetNoMemProtectInstance();
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::HeapBlockMap64::Node>
                (allocator,nextNode);
      nextNode = pNVar1;
    }
  }
  return;
}

Assistant:

void
HeapBlockMap64::Cleanup(bool concurrentFindImplicitRoot)
{
    Node ** prevnext = &this->list;
    Node * node = *prevnext;
    while (node != nullptr)
    {
        node->map.Cleanup(concurrentFindImplicitRoot);
        Node * nextNode = node->next;
        if (!concurrentFindImplicitRoot && node->map.Empty())
        {
            // Concurrent traversals of the node list would result in a race and possible UAF.
            // Currently we simply defer node free for the lifetime of the heap (only affects MemProtect).
            *prevnext = node->next;
            NoMemProtectHeapDelete(node);
        }
        else
        {
            prevnext = &node->next;
        }
        node = nextNode;
    }
}